

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardMachine.hpp
# Opt level: O0

bool __thiscall
MachineTypes::KeyboardMachine::apply_key
          (KeyboardMachine *this,Key key,char symbol,bool is_pressed,bool is_repeat,
          bool map_logically)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined1 auVar5 [16];
  allocator<char> local_89;
  string local_88 [34];
  char local_66 [8];
  char string_1 [2];
  allocator<char> local_51;
  string local_50 [38];
  char local_2a [2];
  long *plStack_28;
  char string [2];
  Keyboard *keyboard;
  bool map_logically_local;
  bool is_repeat_local;
  bool is_pressed_local;
  char symbol_local;
  Key key_local;
  KeyboardMachine *this_local;
  
  iVar2 = (*(this->super_KeyActions)._vptr_KeyActions[5])();
  plStack_28 = (long *)CONCAT44(extraout_var,iVar2);
  if (map_logically) {
    if (((is_pressed) && (symbol != '\0')) &&
       (uVar3 = (*(this->super_KeyActions)._vptr_KeyActions[4])(this,(ulong)(uint)(int)symbol),
       (uVar3 & 1) != 0)) {
      local_66[1] = 0;
      local_66[0] = symbol;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_88,local_66,&local_89);
      (*(this->super_KeyActions)._vptr_KeyActions[3])(this,local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
      this_local._7_1_ = true;
    }
    else {
      bVar1 = (**(code **)(*plStack_28 + 0x10))(plStack_28,key,(int)symbol,is_pressed,is_repeat);
      this_local._7_1_ = (bool)(bVar1 & 1);
    }
  }
  else {
    uVar4 = (ulong)is_pressed;
    auVar5 = (**(code **)(*plStack_28 + 0x10))(plStack_28,key,(int)symbol,uVar4,is_repeat);
    if ((auVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (((is_pressed) && (symbol != '\0')) &&
         (uVar3 = (*(this->super_KeyActions)._vptr_KeyActions[4])
                            (this,(ulong)(uint)(int)symbol,auVar5._8_8_,
                             CONCAT71((int7)(uVar4 >> 8),symbol)), (uVar3 & 1) != 0)) {
        local_2a[1] = 0;
        local_2a[0] = symbol;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_50,local_2a,&local_51);
        (*(this->super_KeyActions)._vptr_KeyActions[3])(this,local_50);
        std::__cxx11::string::~string(local_50);
        std::allocator<char>::~allocator(&local_51);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool apply_key(Inputs::Keyboard::Key key, char symbol, bool is_pressed, bool is_repeat, bool map_logically) {
			Inputs::Keyboard &keyboard = get_keyboard();

			if(!map_logically) {
				// Try a regular keypress first, and stop if that works.
				if(keyboard.set_key_pressed(key, symbol, is_pressed, is_repeat)) {
					return true;
				}

				// That having failed, if a symbol has been supplied then try typing it.
				if(is_pressed && symbol && can_type(symbol)) {
					char string[2] = { symbol, 0 };
					type_string(string);
					return true;
				}

				return false;
			} else {
				// Try to type first.
				if(is_pressed && symbol && can_type(symbol)) {
					char string[2] = { symbol, 0 };
					type_string(string);
					return true;
				}

				// That didn't work. Forward as a keypress. As, either:
				//	(i) this is a key down, but doesn't have a symbol, or is an untypeable symbol; or
				//	(ii) this is a key up, which it won't be an issue to miscommunicate.
				return keyboard.set_key_pressed(key, symbol, is_pressed, is_repeat);
			}
		}